

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

void __thiscall
dnet::data_types::tensor<int,_1U>::tensor(tensor<int,_1U> *this,array<unsigned_int,_1UL> size)

{
  (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->_shape)._M_elems[0] = (uint)size._M_elems[0];
  this->_axes_sort = (_Type)0x0;
  this->_facts = (_Type)0x1;
  std::vector<int,_std::allocator<int>_>::resize(&this->_data,(ulong)(uint)size._M_elems[0]);
  return;
}

Assistant:

tensor<T, N>::tensor(std::array<index_type, N> size)
        {
            for (auto iter = size.begin(); iter != size.end(); iter++) {
                unsigned long i = iter - size.begin();
                if (i >= N) {
                    break;
                }
                this->_shape[i] = *iter;
            }
            this->init(this->_shape);
        }